

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

Promise<void> __thiscall
kj::Promise<void>::attach<capnproto_test::capnp::test::TestInterface::Client>
          (Promise<void> *this,Client *attachments)

{
  Own<kj::_::PromiseNode> *params;
  Client *params_00;
  NoInfer<capnproto_test::capnp::test::TestInterface::Client> *in_RDX;
  PromiseNode *extraout_RDX;
  Promise<void> PVar1;
  ExpandAndApplyResult<kj::_::MakeTupleFunc,_capnproto_test::capnp::test::TestInterface::Client>
  local_58;
  Own<kj::_::AttachmentPromiseNode<capnproto_test::capnp::test::TestInterface::Client>_> local_40;
  Own<kj::_::PromiseNode> local_30;
  NoInfer<capnproto_test::capnp::test::TestInterface::Client> *local_20;
  Client *attachments_local;
  Promise<void> *this_local;
  
  local_20 = in_RDX;
  attachments_local = attachments;
  this_local = this;
  params = mv<kj::Own<kj::_::PromiseNode>>((Own<kj::_::PromiseNode> *)attachments);
  params_00 = fwd<capnproto_test::capnp::test::TestInterface::Client>(local_20);
  tuple<capnproto_test::capnp::test::TestInterface::Client>(&local_58,params_00);
  heap<kj::_::AttachmentPromiseNode<capnproto_test::capnp::test::TestInterface::Client>,kj::Own<kj::_::PromiseNode>,capnproto_test::capnp::test::TestInterface::Client>
            ((kj *)&local_40,params,&local_58);
  Own<kj::_::PromiseNode>::
  Own<kj::_::AttachmentPromiseNode<capnproto_test::capnp::test::TestInterface::Client>,void>
            (&local_30,&local_40);
  Promise(this,false,&local_30);
  Own<kj::_::PromiseNode>::~Own(&local_30);
  Own<kj::_::AttachmentPromiseNode<capnproto_test::capnp::test::TestInterface::Client>_>::~Own
            (&local_40);
  capnproto_test::capnp::test::TestInterface::Client::~Client(&local_58);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar1.super_PromiseBase.node;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false, kj::heap<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
      kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}